

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsrv2.c
# Opt level: O3

_Bool olsrv2_mpr_shall_process(rfc5444_reader_tlvblock_context *context,uint64_t vtime)

{
  byte bVar1;
  oonf_log_source source;
  oonf_duplicate_result oVar2;
  char *pcVar3;
  _Bool _Var4;
  char *pcVar5;
  netaddr_str buf;
  
  if ((context->has_origaddr == true) && (context->has_seqno != false)) {
    oVar2 = oonf_duplicate_entry_add
                      (&_protocol->processed_set,context->msg_type,&context->orig_addr,
                       (ulong)context->seqno,vtime + _olsrv2_config.f_hold_time);
    source = LOG_OLSRV2;
    _Var4 = (_Bool)(0x34U >> ((byte)oVar2 & 0x1f) & oVar2 < (OONF_DUPSET_NEWEST|OONF_DUPSET_NEW));
    if ((log_global_mask[LOG_OLSRV2] & 1) != 0) {
      pcVar5 = "not ";
      if (_Var4 != false) {
        pcVar5 = "";
      }
      bVar1 = context->msg_type;
      pcVar3 = netaddr_to_prefixstring(&buf,&context->orig_addr,false);
      oonf_log(LOG_SEVERITY_DEBUG,source,"src/olsrv2/olsrv2/olsrv2.c",0x19e,(void *)0x0,0,
               "Do %sprocess message type %u from %s with seqno %u (dupset result: %u)",pcVar5,
               (ulong)bVar1,pcVar3,(ulong)context->seqno,(ulong)oVar2);
    }
  }
  else if ((log_global_mask[LOG_OLSRV2] & 1) == 0) {
    _Var4 = false;
  }
  else {
    _Var4 = false;
    oonf_log(LOG_SEVERITY_DEBUG,LOG_OLSRV2,"src/olsrv2/olsrv2/olsrv2.c",0x192,(void *)0x0,0,
             "Do not process message type %u, originator or sequence number is missing!",
             (ulong)context->msg_type);
  }
  return _Var4;
}

Assistant:

bool
olsrv2_mpr_shall_process(struct rfc5444_reader_tlvblock_context *context, uint64_t vtime) {
  enum oonf_duplicate_result dup_result;
  bool process;
#ifdef OONF_LOG_DEBUG_INFO
  struct netaddr_str buf;
#endif

  /* check if message has originator and sequence number */
  if (!context->has_origaddr || !context->has_seqno) {
    OONF_DEBUG(LOG_OLSRV2,
      "Do not process message type %u,"
      " originator or sequence number is missing!",
      context->msg_type);
    return false;
  }

  /* check forwarding set */
  dup_result = oonf_duplicate_entry_add(&_protocol->processed_set, context->msg_type, &context->orig_addr,
    context->seqno, vtime + _olsrv2_config.f_hold_time);
  process = oonf_duplicate_is_new(dup_result);

  OONF_DEBUG(LOG_OLSRV2,
    "Do %sprocess message type %u from %s"
    " with seqno %u (dupset result: %u)",
    process ? "" : "not ", context->msg_type, netaddr_to_string(&buf, &context->orig_addr), context->seqno, dup_result);
  return process;
}